

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

float __thiscall experimental::pdf(experimental *this,Ray *ray,Vector3f *dir,Hit *h)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector3f spec;
  Vector3f diff;
  Vector3f local_44;
  Vector3f local_38;
  Vector3f local_2c;
  
  Vector3f::Vector3f(&local_38,&h->material->_diffuseColor);
  Vector3f::Vector3f(&local_44,&h->material->_specularColor);
  pfVar3 = Vector3f::operator[](&local_38,0);
  fVar6 = *pfVar3;
  pfVar3 = Vector3f::operator[](&local_38,1);
  fVar4 = *pfVar3;
  pfVar3 = Vector3f::operator[](&local_38,2);
  fVar5 = *pfVar3;
  pfVar3 = Vector3f::operator[](&local_44,0);
  fVar1 = *pfVar3;
  pfVar3 = Vector3f::operator[](&local_44,1);
  fVar2 = *pfVar3;
  pfVar3 = Vector3f::operator[](&local_44,2);
  fVar5 = 1.0 / ((fVar6 + fVar4 + fVar5) / (fVar1 + fVar2 + *pfVar3) + 1.0);
  Vector3f::Vector3f(&local_2c,&h->normal);
  fVar4 = Vector3f::dot(dir,&local_2c);
  fVar6 = 0.0;
  if (0.0 <= fVar4) {
    fVar6 = fVar4;
  }
  return (fVar6 / 3.1415927) * (1.0 - fVar5) + 0.0 + fVar5;
}

Assistant:

float experimental::pdf(const Ray &ray, const Vector3f &dir, Hit &h) const {
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));

    float pdf = 0;
    Sampler* sampler_diff = new cosineWeightedHemisphere;
    pdf += (1-prob_spec) * sampler_diff->pdf(ray, dir, h);
    Sampler* sampler_ref = new pureReflectance;
    pdf += prob_spec * sampler_ref->pdf(ray, dir, h);

    return pdf;
}